

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

void __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::ChannelGroupManifest(ChannelGroupManifest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_lifeTime = LIFETIME_STABLE;
  std::__cxx11::string::string((string *)&this->_hashScheme,(string *)UNKNOWN_abi_cxx11_);
  std::__cxx11::string::string((string *)&this->_encodingScheme,(string *)UNKNOWN_abi_cxx11_);
  p_Var1 = &(this->_table)._M_t._M_impl.super__Rb_tree_header;
  (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_insertionIterator)._M_node = (_Base_ptr)0x0;
  this->_insertingEntry = false;
  return;
}

Assistant:

IDManifest::ChannelGroupManifest::ChannelGroupManifest ()
    : _lifeTime (IDManifest::LIFETIME_STABLE)
    , _hashScheme (IDManifest::UNKNOWN)
    , _encodingScheme (IDManifest::UNKNOWN)
    , _insertingEntry (false)
{}